

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cc
# Opt level: O3

int main(int argc,char **argv)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  ostream *os_;
  undefined1 local_558 [8];
  Parg pg;
  ostream os;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_148;
  string local_138;
  string local_118;
  string local_f8;
  string local_d8;
  string local_b8;
  string local_98;
  string local_78;
  undefined8 local_58;
  winsize w;
  long local_48 [2];
  flush local_31;
  
  OB::Parg::Parg((Parg *)local_558,argc,argv);
  iVar3 = program_options((Parg *)local_558);
  iVar4 = 0;
  if (iVar3 < 1) {
    if (iVar3 < 0) {
      iVar4 = 1;
    }
    else {
      OB::Term::ostream::ostream
                ((ostream *)
                 &pg.similar_.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,(ostream *)&std::cout,2,
                 0xffffffffffffffff);
      os.super_ostream._96_1_ = 0;
      os._472_8_ = &local_148;
      std::__cxx11::string::_M_construct<char_const*>((string *)&os.field_0x1d8,"line-wrap","");
      bVar1 = OB::Parg::get<bool>((Parg *)local_558,(string *)&os.field_0x1d8);
      bVar2 = true;
      if (!bVar1) {
        local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_138,"auto-wrap","");
        bVar2 = OB::Parg::get<bool>((Parg *)local_558,&local_138);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_138._M_dataplus._M_p != &local_138.field_2) {
          operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)os._472_8_ != &local_148) {
        operator_delete((void *)os._472_8_,local_148._M_allocated_capacity + 1);
      }
      if (bVar2 != false) {
        os.super_ostream._96_1_ = 1;
        local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"auto-wrap","");
        os.super_ostream._98_1_ = OB::Parg::get<bool>((Parg *)local_558,&local_118);
        os.super_ostream._120_8_ = 0;
        *(undefined1 *)os.super_ostream._112_8_ = 0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_118._M_dataplus._M_p != &local_118.field_2) {
          operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
        }
        local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"first-wrap","");
        bVar1 = OB::Parg::get<bool>((Parg *)local_558,&local_f8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
          operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
        }
        if (bVar1) {
          os.super_ostream._97_1_ = 0;
        }
        local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"width","");
        bVar1 = OB::Parg::find((Parg *)local_558,&local_d8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
          operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
        }
        if (bVar1) {
          local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"width","");
          os.super_ostream._72_8_ = OB::Parg::get<unsigned_long>((Parg *)local_558,&local_b8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
            operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
          }
        }
        else {
          iVar4 = isatty(1);
          if (iVar4 != 0) {
            ioctl(1,0x5413,&local_58);
            os.super_ostream._72_8_ = ZEXT28(local_58._2_2_);
          }
        }
      }
      local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"ansi","");
      bVar1 = OB::Parg::get<bool>((Parg *)local_558,&local_98);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_dataplus._M_p != &local_98.field_2) {
        operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
      }
      if (!bVar1) {
        os.super_ostream._101_1_ = 0;
        os.super_ostream._184_8_ = 0;
        *(undefined1 *)os.super_ostream._176_8_ = 0;
      }
      local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"white-space","");
      bVar1 = OB::Parg::get<bool>((Parg *)local_558,&local_78);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p != &local_78.field_2) {
        operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
      }
      if (!bVar1) {
        os.super_ostream._100_1_ = 0;
      }
      local_58 = local_48;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_58,
                 pg.positional_vec_.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage,
                 pg.stdin_._M_dataplus._M_p +
                 (long)pg.positional_vec_.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
      os_ = std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)
                       &pg.similar_.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage,(char *)local_58,(long)w)
      ;
      OB::Term::iomanip::operator<<(os_,&local_31);
      if (local_58 != local_48) {
        operator_delete(local_58,local_48[0] + 1);
      }
      pg.similar_.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           (pointer)(OB::Term::ostream::vtable + 0x18);
      os.super_ostream._208_8_ = 0x112c68;
      OB::Term::ostream::streambuf::~streambuf((streambuf *)&os);
      std::ios_base::~ios_base((ios_base *)&os.super_ostream.field_0xd0);
      iVar4 = 0;
    }
  }
  OB::Parg::~Parg((Parg *)local_558);
  return iVar4;
}

Assistant:

int main(int argc, char *argv[])
{
  Parg pg {argc, argv};
  int pstatus {program_options(pg)};
  if (pstatus > 0) return 0;
  if (pstatus < 0) return 1;

  try
  {
    OB::Term::ostream os {std::cout};

    os.line_wrap(false);

    if (pg.get<bool>("line-wrap") || pg.get<bool>("auto-wrap"))
    {
      os.line_wrap(true);
      os.auto_wrap(pg.get<bool>("auto-wrap"));

      if (pg.get<bool>("first-wrap"))
      {
        os.first_wrap(false);
      }

      if (pg.find("width"))
      {
        os.width(pg.get<std::size_t>("width"));
      }
      else
      {
        if (OB::Term::is_term(STDOUT_FILENO))
        {
          os.width(OB::Term::width(STDOUT_FILENO));
        }
      }
    }

    if (! pg.get<bool>("ansi"))
    {
      os.escape_codes(false);
    }

    if (! pg.get<bool>("white-space"))
    {
      os.white_space(false);
    }

    os
    << pg.get_stdin()
    << OB::Term::iomanip::flush();
  }
  catch(std::exception const& e)
  {
    std::cerr << "Error: " << e.what() << "\n";
  }
  catch(...)
  {
    std::cerr << "Error: an unexpected error occurred\n";
  }

  return 0;
}